

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsModule.cpp
# Opt level: O0

AsmJsSymbol * __thiscall
Js::AsmJsModuleCompiler::LookupIdentifier
          (AsmJsModuleCompiler *this,PropertyName name,AsmJsFunc *func,Source *lookupSource)

{
  AsmJsSymbol *pAVar1;
  AsmJsSymbol **ppAVar2;
  AsmJsSymbol *local_48;
  PropertyId local_3c;
  AsmJsSymbol *local_38;
  AsmJsSymbol *lookupResult;
  Source *lookupSource_local;
  AsmJsFunc *func_local;
  PropertyName name_local;
  AsmJsModuleCompiler *this_local;
  
  local_38 = (AsmJsSymbol *)0x0;
  if (name != (PropertyName)0x0) {
    lookupResult = (AsmJsSymbol *)lookupSource;
    lookupSource_local = (Source *)func;
    func_local = (AsmJsFunc *)name;
    name_local = (PropertyName)this;
    if ((func != (AsmJsFunc *)0x0) &&
       (pAVar1 = AsmJsFunc::LookupIdentifier(func,name,lookupSource), pAVar1 != (AsmJsSymbol *)0x0))
    {
      return pAVar1;
    }
    local_38 = (AsmJsSymbol *)0x0;
    local_3c = Ident::GetPropertyId((Ident *)func_local);
    local_48 = (AsmJsSymbol *)0x0;
    ppAVar2 = JsUtil::
              BaseDictionary<int,_Js::AsmJsSymbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::LookupWithKey<int>(&this->mModuleEnvironment,&local_3c,&local_48);
    local_38 = *ppAVar2;
    if (lookupResult != (AsmJsSymbol *)0x0) {
      *(undefined4 *)&lookupResult->_vptr_AsmJsSymbol = 0;
    }
  }
  return local_38;
}

Assistant:

AsmJsSymbol* AsmJsModuleCompiler::LookupIdentifier(PropertyName name, AsmJsFunc* func /*= nullptr */, AsmJsLookupSource::Source* lookupSource /*= nullptr*/)
    {
        AsmJsSymbol* lookupResult = nullptr;
        if (name)
        {
            if (func)
            {
                lookupResult = func->LookupIdentifier(name, lookupSource);
                if (lookupResult)
                {
                    return lookupResult;
                }
            }

            lookupResult = mModuleEnvironment.LookupWithKey(name->GetPropertyId(), nullptr);
            if (lookupSource)
            {
                *lookupSource = AsmJsLookupSource::AsmJsModule;
            }
        }
        return lookupResult;
    }